

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
          (SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U> *this,int *key,VmConstant **value)

{
  uint uVar1;
  Node *pNVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0x3b,
                  "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
                 );
  }
  uVar5 = this->bucketCount;
  if (uVar5 <= (this->count >> 2) + this->count) {
    rehash(this);
    uVar5 = this->bucketCount;
    if (uVar5 == 0) goto LAB_001a5f1e;
  }
  uVar1 = uVar5 - 1;
  iVar3 = *key;
  uVar6 = iVar3 * -0x61c8864f;
  iVar7 = 0;
  do {
    uVar6 = uVar6 & uVar1;
    pNVar2 = this->data + uVar6;
    iVar4 = this->data[uVar6].key;
    if (iVar4 == 0) {
      pNVar2->key = iVar3;
      pNVar2->value = *value;
      this->count = this->count + 1;
      return;
    }
    if (iVar4 == iVar3) {
      pNVar2->value = *value;
      return;
    }
    uVar6 = uVar6 + iVar7 + 1;
    iVar7 = iVar7 + 1;
    uVar5 = uVar5 - 1;
  } while (uVar5 != 0);
LAB_001a5f1e:
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x5b,
                "void SmallDenseMap<int, VmConstant *, IntHasher, 8>::insert(const Key &, const Value &) [Key = int, Value = VmConstant *, Hasher = IntHasher, N = 8]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}